

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O1

void srotg(float *sa,float *sb,float *c,float *s)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = ABS(*sb);
  fVar3 = ABS(*sa);
  fVar5 = fVar4 + fVar3;
  fVar2 = 0.0;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    pfVar1 = sb;
    if (fVar4 < fVar3) {
      pfVar1 = sa;
    }
    fVar2 = *pfVar1;
    fVar3 = *sa / fVar5;
    fVar4 = *sb / fVar5;
    fVar3 = fVar3 * fVar3 + fVar4 * fVar4;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar4 = r4_sign(fVar2);
    fVar4 = fVar4 * fVar5 * fVar3;
    *c = *sa / fVar4;
    fVar2 = *sb / fVar4;
  }
  else {
    *c = 1.0;
    fVar4 = 0.0;
  }
  *s = fVar2;
  fVar3 = *c;
  if (fVar3 != 0.0) {
    fVar2 = (float)(-(uint)(fVar2 < ABS(fVar3)) & (uint)fVar2 |
                   ~-(uint)(fVar2 < ABS(fVar3)) & (uint)(1.0 / fVar3));
  }
  *sa = fVar4;
  *sb = fVar2;
  return;
}

Assistant:

void srotg ( float *sa, float *sb, float *c, float *s )

//****************************************************************************80
//
//  Purpose:
//
//    SROTG constructs a float Givens plane rotation.
//
//  Discussion:
//
//    Given values A and B, this routine computes
//
//    SIGMA = sign ( A ) if abs ( A ) >  abs ( B )
//          = sign ( B ) if abs ( A ) <= abs ( B );
//
//    R     = SIGMA * ( A * A + B * B );
//
//    C = A / R if R is not 0
//      = 1     if R is 0;
//
//    S = B / R if R is not 0,
//        0     if R is 0.
//
//    The computed numbers then satisfy the equation
//
//    (  C  S ) ( A ) = ( R )
//    ( -S  C ) ( B ) = ( 0 )
//
//    The routine also computes
//
//    Z = S     if abs ( A ) > abs ( B ),
//      = 1 / C if abs ( A ) <= abs ( B ) and C is not 0,
//      = 1     if C is 0.
//
//    The single value Z encodes C and S, and hence the rotation:
//
//    If Z = 1, set C = 0 and S = 1;
//    If abs ( Z ) < 1, set C = sqrt ( 1 - Z * Z ) and S = Z;
//    if abs ( Z ) > 1, set C = 1/ Z and S = sqrt ( 1 - C * C );
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 May 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input/output, float *SA, *SB,  On input, SA and SB are the values
//    A and B.  On output, SA is overwritten with R, and SB is
//    overwritten with Z.
//
//    Output, float *C, *S, the cosine and sine of the Givens rotation.
//
{
  float r;
  float roe;
  float scale;
  float z;

  if ( fabs ( *sb ) < fabs ( *sa ) )
  {
    roe = *sa;
  }
  else
  {
    roe = *sb;
  }

  scale = fabs ( *sa ) + fabs ( *sb );

  if ( scale == 0.0 )
  {
    *c = 1.0;
    *s = 0.0;
    r = 0.0;
  }
  else
  {
    r = scale * sqrt ( ( *sa / scale ) * ( *sa / scale )
                     + ( *sb / scale ) * ( *sb / scale ) );
    r = r4_sign ( roe ) * r;
    *c = *sa / r;
    *s = *sb / r;
  }

  if ( 0.0 < fabs ( *c ) && fabs ( *c ) <= *s )
  {
    z = 1.0 / *c;
  }
  else
  {
    z = *s;
  }

  *sa = r;
  *sb = z;

  return;
}